

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O0

int __thiscall Selector::shutdown(Selector *this,int __fd,int __how)

{
  bool bVar1;
  uint uVar2;
  Event *this_00;
  Thread *pTVar3;
  char *pcVar4;
  char *pcVar5;
  Selector *extraout_RAX;
  Selector *this_local;
  
  if ((this->mShutdown & 1U) == 0) {
    this->mShutdown = true;
    this_00 = (Event *)operator_new(0x18,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                                    ,0x4e);
    Event::Event(this_00,-2,1);
    EventDispatcher::sendEvent(&this->super_EventDispatcher,this_00);
    pTVar3 = JHThread::Thread::GetCurrent();
    bVar1 = JHThread::Thread::operator==(&(this->mThread).super_Thread,pTVar3);
    if (bVar1) {
      pTVar3 = JHThread::Thread::GetCurrent();
      pcVar4 = JHThread::Thread::GetName(pTVar3);
      pcVar5 = JHThread::Thread::GetName(&(this->mThread).super_Thread);
      jh_log_print(2,"void Selector::shutdown()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                   ,0x57,"%s declining to call Join() on %s",pcVar4,pcVar5);
      this = extraout_RAX;
    }
    else {
      JHThread::Thread::Stop(&(this->mThread).super_Thread);
      uVar2 = JHThread::Thread::Join(&(this->mThread).super_Thread);
      this = (Selector *)(ulong)uVar2;
    }
  }
  return (int)this;
}

Assistant:

void Selector::shutdown()
{
	if ( not mShutdown )
	{
		mShutdown = true;
		EventDispatcher::sendEvent( jh_new Event( Event::kShutdownEventId,
												  PRIORITY_HIGH ) );

		// Selectors should not be shutdown by their own threads.
		// This is dangerous.
		if ( mThread == *Thread::GetCurrent() )
		{
			LOG_WARN( "%s declining to call Join() on %s",
					  Thread::GetCurrent()->GetName(),
					  mThread.GetName() );
		}
		else
		{
			LOG_NOISE( "%s waiting for thread %s to die",
					   Thread::GetCurrent()->GetName(),
					   mThread.GetName() );
			mThread.Stop();
			mThread.Join();
		}
	}
}